

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::VertexArrayObjectTestGroup::init
          (VertexArrayObjectTestGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  VertexArrayObjectTest *pVVar1;
  MultiVertexArrayObjectTest *this_00;
  VertexArrayState state;
  undefined1 local_138 [20];
  undefined8 uStack_124;
  int iStack_11c;
  undefined1 local_118 [16];
  pointer local_108;
  int local_100;
  undefined1 local_f8 [16];
  pointer local_e8;
  int local_e0;
  undefined1 local_d8 [16];
  pointer local_c8;
  value_type local_c0;
  value_type local_98;
  undefined1 local_70 [12];
  undefined1 local_64 [16];
  int local_54;
  undefined8 local_50;
  undefined1 local_48 [12];
  undefined1 local_3c [16];
  int local_2c;
  undefined8 local_28;
  
  local_54 = 0;
  local_70._0_4_ = 0x30;
  local_70._4_4_ = 0x180;
  local_c0.componentCount = 2;
  local_64._0_12_ = ZEXT412(0x1406) << 0x40;
  local_64._12_4_ = 0;
  local_50._0_4_ = -1.0;
  local_50._4_4_ = 1.0;
  local_2c = 0;
  local_48._0_4_ = 0x30;
  local_48._4_4_ = 0x180;
  local_3c._0_12_ = ZEXT412(0x1406) << 0x40;
  local_3c._12_4_ = 0;
  local_28._0_4_ = -1.0;
  local_28._4_4_ = 1.0;
  local_c0.stride = 0;
  local_c0.offset = 0;
  local_c0.floatRangeMin = 0.0;
  local_c0.floatRangeMax = 0.0;
  local_c0.count = 0x30;
  local_c0.size = 0xc0;
  local_138._0_4_ = -1;
  local_138._4_4_ = -1;
  local_c0.type = 0x1402;
  local_c0.intRangeMin = -0x8000;
  local_138[8] = false;
  uStack_124._0_4_ = 0xffffffff;
  local_138._12_8_ = 0xffffffff00000000;
  uStack_124._4_4_ = 0xffffffff;
  iStack_11c = -1;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = -1;
  local_c0.intRangeMax = 0x8000;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = -1;
  local_d8 = (undefined1  [16])0x0;
  local_c8 = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.elementArrayBuffer = -1;
  local_98.count = local_98.count & 0xffffff00;
  local_98.size = 1;
  local_98.componentCount = 0;
  local_98.stride = 0x1406;
  local_98.offset = local_98.offset & 0xffffff00;
  local_98.floatRangeMin = 0.0;
  local_98.intRangeMax = local_98.intRangeMax & 0xffffff00;
  local_98.type = 0;
  local_98.intRangeMin = 0;
  local_70._8_4_ = local_c0.componentCount;
  local_48._8_4_ = local_c0.componentCount;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back(&state.attributes,(value_type *)&local_98);
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->enabled = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->size = 2;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->type = 0x1406;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->integer = '\0';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->divisor = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalized = '\0';
  state.elementArrayBuffer = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,(value_type *)local_70);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,(value_type *)local_48);
  local_138[8] = false;
  local_138._0_4_ = 0x30;
  local_138._4_4_ = 0;
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_f8,&state);
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_118,&state);
  stack0xfffffffffffffed4 = (undefined1  [16])0x0;
  iStack_11c = 0;
  *(int *)(local_118._0_8_ + 0x20) = 1;
  *(int *)(local_f8._0_8_ + 0x20) = 2;
  pVVar1 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar1,(this->super_TestCaseGroup).m_context,(Spec *)local_138,"diff_buffer",
             "diff_buffer");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar1);
  std::
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                   *)&state);
  Functional::anon_unknown_0::Spec::~Spec((Spec *)local_138);
  local_138._0_4_ = -1;
  local_138._4_4_ = -1;
  local_138[8] = false;
  uStack_124._0_4_ = 0xffffffff;
  local_138._12_8_ = 0xffffffff00000000;
  uStack_124._4_4_ = 0xffffffff;
  iStack_11c = -1;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = -1;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = -1;
  local_c8 = (pointer)0x0;
  local_d8 = (undefined1  [16])0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.elementArrayBuffer = -1;
  local_98.count = local_98.count & 0xffffff00;
  local_98.size = 1;
  local_98.componentCount = 0;
  local_98.stride = 0x1406;
  local_98.offset = local_98.offset & 0xffffff00;
  local_98.floatRangeMin = 0.0;
  local_98.intRangeMax = local_98.intRangeMax & 0xffffff00;
  local_98.type = 0;
  local_98.intRangeMin = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back(&state.attributes,(value_type *)&local_98);
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->enabled = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->size = 2;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->type = 0x1406;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->integer = '\0';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalized = '\0';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->divisor = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->bufferNdx = 1;
  state.elementArrayBuffer = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,(value_type *)local_70);
  local_138[8] = false;
  local_138._0_4_ = 0x18;
  local_138._4_4_ = 0;
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_f8,&state);
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_118,&state);
  stack0xfffffffffffffed4 = (undefined1  [16])0x0;
  iStack_11c = 0;
  *(GLint *)(local_118._0_8_ + 4) = 2;
  *(GLint *)(local_f8._0_8_ + 4) = 3;
  pVVar1 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar1,(this->super_TestCaseGroup).m_context,(Spec *)local_138,"diff_size","diff_size")
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar1);
  std::
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                   *)&state);
  Functional::anon_unknown_0::Spec::~Spec((Spec *)local_138);
  local_138._0_4_ = -1;
  local_138._4_4_ = -1;
  local_138[8] = false;
  uStack_124._0_4_ = 0xffffffff;
  local_138._12_8_ = 0xffffffff00000000;
  uStack_124._4_4_ = 0xffffffff;
  iStack_11c = -1;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = -1;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = -1;
  local_c8 = (pointer)0x0;
  local_d8 = (undefined1  [16])0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.elementArrayBuffer = -1;
  local_98.count = local_98.count & 0xffffff00;
  local_98.size = 1;
  local_98.componentCount = 0;
  local_98.stride = 0x1406;
  local_98.offset = local_98.offset & 0xffffff00;
  local_98.floatRangeMin = 0.0;
  local_98.intRangeMax = local_98.intRangeMax & 0xffffff00;
  local_98.type = 0;
  local_98.intRangeMin = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back(&state.attributes,(value_type *)&local_98);
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->enabled = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->size = 2;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->type = 0x1402;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->integer = '\0';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->divisor = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalized = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->bufferNdx = 1;
  state.elementArrayBuffer = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,&local_c0);
  local_138[8] = false;
  local_138._0_4_ = 0x18;
  local_138._4_4_ = 0;
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_f8,&state);
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_118,&state);
  stack0xfffffffffffffed4 = (undefined1  [16])0x0;
  iStack_11c = 0;
  *(GLint *)(local_f8._0_8_ + 8) = 2;
  *(GLint *)(local_118._0_8_ + 8) = 4;
  pVVar1 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar1,(this->super_TestCaseGroup).m_context,(Spec *)local_138,"diff_stride",
             "diff_stride");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar1);
  std::
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                   *)&state);
  Functional::anon_unknown_0::Spec::~Spec((Spec *)local_138);
  local_138._0_4_ = -1;
  local_138._4_4_ = -1;
  local_138[8] = false;
  uStack_124._0_4_ = 0xffffffff;
  local_138._12_8_ = 0xffffffff00000000;
  uStack_124._4_4_ = 0xffffffff;
  iStack_11c = -1;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = -1;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = -1;
  local_c8 = (pointer)0x0;
  local_d8 = (undefined1  [16])0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.elementArrayBuffer = -1;
  local_98.count = local_98.count & 0xffffff00;
  local_98.size = 1;
  local_98.componentCount = 0;
  local_98.stride = 0x1406;
  local_98.offset = local_98.offset & 0xffffff00;
  local_98.floatRangeMin = 0.0;
  local_98.intRangeMax = local_98.intRangeMax & 0xffffff00;
  local_98.type = 0;
  local_98.intRangeMin = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back(&state.attributes,(value_type *)&local_98);
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->enabled = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->size = 2;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->type = 0x1402;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->integer = '\0';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->divisor = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalized = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->bufferNdx = 1;
  state.elementArrayBuffer = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,&local_c0);
  local_138[8] = false;
  local_138._0_4_ = 0x18;
  local_138._4_4_ = 0;
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_f8,&state);
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_118,&state);
  stack0xfffffffffffffed4 = (undefined1  [16])0x0;
  iStack_11c = 0;
  *(GLenum *)(local_f8._0_8_ + 0xc) = 0x1402;
  *(GLenum *)(local_118._0_8_ + 0xc) = 0x1400;
  pVVar1 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar1,(this->super_TestCaseGroup).m_context,(Spec *)local_138,"diff_type","diff_type")
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar1);
  std::
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                   *)&state);
  Functional::anon_unknown_0::Spec::~Spec((Spec *)local_138);
  local_138._0_4_ = -1;
  local_138._4_4_ = -1;
  local_138[8] = false;
  uStack_124._0_4_ = 0xffffffff;
  local_138._12_8_ = 0xffffffff00000000;
  uStack_124._4_4_ = 0xffffffff;
  iStack_11c = -1;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = -1;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = -1;
  local_c8 = (pointer)0x0;
  local_d8 = (undefined1  [16])0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.elementArrayBuffer = -1;
  local_98.count = local_98.count & 0xffffff00;
  local_98.size = 1;
  local_98.componentCount = 0;
  local_98.stride = 0x1406;
  local_98.offset = local_98.offset & 0xffffff00;
  local_98.floatRangeMin = 0.0;
  local_98.intRangeMax = local_98.intRangeMax & 0xffffff00;
  local_98.type = 0;
  local_98.intRangeMin = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back(&state.attributes,(value_type *)&local_98);
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->enabled = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->size = 2;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->type = 0x1400;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->integer = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->divisor = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalized = '\0';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->bufferNdx = 1;
  state.elementArrayBuffer = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,&local_c0);
  local_138[8] = false;
  local_138._0_4_ = 0x18;
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_f8,&state);
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_118,&state);
  local_138._0_8_ = local_138._0_8_ & 0xffffffff;
  stack0xfffffffffffffed4 = (undefined1  [16])0x0;
  iStack_11c = 0;
  *(GLboolean *)(local_118._0_8_ + 0x10) = '\0';
  *(GLboolean *)(local_f8._0_8_ + 0x10) = '\x01';
  pVVar1 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar1,(this->super_TestCaseGroup).m_context,(Spec *)local_138,"diff_integer",
             "diff_integer");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar1);
  std::
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                   *)&state);
  Functional::anon_unknown_0::Spec::~Spec((Spec *)local_138);
  local_138._0_4_ = -1;
  local_138._4_4_ = -1;
  local_138[8] = false;
  uStack_124._0_4_ = 0xffffffff;
  local_138._12_8_ = 0xffffffff00000000;
  uStack_124._4_4_ = 0xffffffff;
  iStack_11c = -1;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = -1;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = -1;
  local_c8 = (pointer)0x0;
  local_d8 = (undefined1  [16])0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.elementArrayBuffer = -1;
  local_98.count = local_98.count & 0xffffff00;
  local_98.size = 1;
  local_98.componentCount = 0;
  local_98.stride = 0x1406;
  local_98.offset = local_98.offset & 0xffffff00;
  local_98.floatRangeMin = 0.0;
  local_98.intRangeMax = local_98.intRangeMax & 0xffffff00;
  local_98.type = 0;
  local_98.intRangeMin = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back(&state.attributes,(value_type *)&local_98);
  local_98.count = local_98.count & 0xffffff00;
  local_98.size = 1;
  local_98.componentCount = 0;
  local_98.stride = 0x1406;
  local_98.offset = local_98.offset & 0xffffff00;
  local_98.floatRangeMin = 0.0;
  local_98.intRangeMax = local_98.intRangeMax & 0xffffff00;
  local_98.type = 0;
  local_98.intRangeMin = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back(&state.attributes,(value_type *)&local_98);
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->enabled = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->size = 2;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->type = 0x1402;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->integer = '\0';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->divisor = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalized = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->bufferNdx = 1;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start[1].enabled = '\x01';
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start[1].size = 4;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start[1].stride = 0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start[1].type = 0x1406;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start[1].integer = '\0';
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start[1].normalized = '\0';
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start[1].divisor = 0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start[1].offset = 0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start[1].bufferNdx = 2;
  state.elementArrayBuffer = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,&local_c0);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,(value_type *)local_70);
  local_138[8] = false;
  local_138._0_4_ = 0xc;
  local_138._4_4_ = 10;
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_f8,&state);
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_118,&state);
  stack0xfffffffffffffed4 = (undefined1  [16])0x0;
  iStack_11c = 0;
  ((pointer)(local_f8._0_8_ + 0x24))->divisor = 3;
  ((pointer)(local_118._0_8_ + 0x24))->divisor = 2;
  pVVar1 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar1,(this->super_TestCaseGroup).m_context,(Spec *)local_138,"diff_divisor",
             "diff_divisor");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar1);
  std::
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                   *)&state);
  Functional::anon_unknown_0::Spec::~Spec((Spec *)local_138);
  local_138._0_4_ = -1;
  local_138._4_4_ = -1;
  local_138[8] = false;
  uStack_124._0_4_ = 0xffffffff;
  local_138._12_8_ = 0xffffffff00000000;
  uStack_124._4_4_ = 0xffffffff;
  iStack_11c = -1;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = -1;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = -1;
  local_c8 = (pointer)0x0;
  local_d8 = (undefined1  [16])0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.elementArrayBuffer = -1;
  local_98.count = local_98.count & 0xffffff00;
  local_98.size = 1;
  local_98.componentCount = 0;
  local_98.stride = 0x1406;
  local_98.offset = local_98.offset & 0xffffff00;
  local_98.floatRangeMin = 0.0;
  local_98.intRangeMax = local_98.intRangeMax & 0xffffff00;
  local_98.type = 0;
  local_98.intRangeMin = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back(&state.attributes,(value_type *)&local_98);
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->enabled = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->size = 2;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->type = 0x1402;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->integer = '\0';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->divisor = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalized = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->bufferNdx = 1;
  state.elementArrayBuffer = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,&local_c0);
  local_138[8] = false;
  local_138._0_4_ = 0x18;
  local_138._4_4_ = 0;
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_f8,&state);
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_118,&state);
  stack0xfffffffffffffed4 = (undefined1  [16])0x0;
  iStack_11c = 0;
  *(GLint *)(local_f8._0_8_ + 0x18) = 2;
  *(GLint *)(local_118._0_8_ + 0x18) = 4;
  pVVar1 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar1,(this->super_TestCaseGroup).m_context,(Spec *)local_138,"diff_offset",
             "diff_offset");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar1);
  std::
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                   *)&state);
  Functional::anon_unknown_0::Spec::~Spec((Spec *)local_138);
  local_138._0_4_ = -1;
  local_138._4_4_ = -1;
  local_138[8] = false;
  uStack_124._0_4_ = 0xffffffff;
  local_138._12_8_ = 0xffffffff00000000;
  uStack_124._4_4_ = 0xffffffff;
  iStack_11c = -1;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = -1;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = -1;
  local_c8 = (pointer)0x0;
  local_d8 = (undefined1  [16])0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.elementArrayBuffer = -1;
  local_98.count = local_98.count & 0xffffff00;
  local_98.size = 1;
  local_98.componentCount = 0;
  local_98.stride = 0x1406;
  local_98.offset = local_98.offset & 0xffffff00;
  local_98.floatRangeMin = 0.0;
  local_98.intRangeMax = local_98.intRangeMax & 0xffffff00;
  local_98.type = 0;
  local_98.intRangeMin = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back(&state.attributes,(value_type *)&local_98);
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->enabled = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->size = 2;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->type = 0x1402;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->integer = '\0';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->divisor = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalized = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->bufferNdx = 1;
  state.elementArrayBuffer = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,&local_c0);
  local_138[8] = false;
  local_138._0_4_ = 0x30;
  local_138._4_4_ = 0;
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_f8,&state);
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_118,&state);
  stack0xfffffffffffffed4 = (undefined1  [16])0x0;
  iStack_11c = 0;
  *(GLboolean *)(local_f8._0_8_ + 0x1c) = '\x01';
  *(GLboolean *)(local_118._0_8_ + 0x1c) = '\0';
  pVVar1 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar1,(this->super_TestCaseGroup).m_context,(Spec *)local_138,"diff_normalize",
             "diff_normalize");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar1);
  std::
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                   *)&state);
  Functional::anon_unknown_0::Spec::~Spec((Spec *)local_138);
  local_138._0_4_ = -1;
  local_138._4_4_ = -1;
  local_138[8] = false;
  uStack_124._0_4_ = 0xffffffff;
  local_138._12_8_ = 0xffffffff00000000;
  uStack_124._4_4_ = 0xffffffff;
  iStack_11c = -1;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = -1;
  local_e8 = (pointer)0x0;
  local_f8 = (undefined1  [16])0x0;
  local_e0 = -1;
  local_c8 = (pointer)0x0;
  local_d8 = (undefined1  [16])0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.attributes.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.elementArrayBuffer = -1;
  local_98.count = local_98.count & 0xffffff00;
  local_98.size = 1;
  local_98.componentCount = 0;
  local_98.stride = 0x1406;
  local_98.offset = local_98.offset & 0xffffff00;
  local_98.floatRangeMin = 0.0;
  local_98.intRangeMax = local_98.intRangeMax & 0xffffff00;
  local_98.type = 0;
  local_98.intRangeMin = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back(&state.attributes,(value_type *)&local_98);
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->enabled = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->size = 2;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->stride = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->type = 0x1406;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->integer = '\0';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->divisor = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->offset = 0;
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->normalized = '\x01';
  (state.attributes.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
   ._M_impl.super__Vector_impl_data._M_start)->bufferNdx = 1;
  state.elementArrayBuffer = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,(value_type *)local_70);
  local_98.stride = 0;
  local_98.offset = 0;
  local_98.intRangeMin = 0;
  local_98.floatRangeMin = 0.0;
  local_98.floatRangeMax = 0.0;
  local_98.count = 0x18;
  local_98.size = 0xc0;
  local_98.componentCount = 1;
  local_98.type = 0x1403;
  local_98.intRangeMax = 0x30;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_d8,&local_98);
  local_138[8] = true;
  local_138._0_4_ = 0x18;
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_f8,&state);
  Functional::anon_unknown_0::VertexArrayState::operator=((VertexArrayState *)local_118,&state);
  local_138._0_8_ = local_138._0_8_ & 0xffffffff;
  uStack_124 = 0x3000000000;
  local_138._12_8_ = 0x1403;
  iStack_11c = 0x18;
  local_100 = 0;
  local_e0 = 2;
  pVVar1 = (VertexArrayObjectTest *)operator_new(0x138);
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar1,(this->super_TestCaseGroup).m_context,(Spec *)local_138,"diff_indices",
             "diff_indices");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pVVar1);
  std::
  _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::~_Vector_base((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                   *)&state);
  Functional::anon_unknown_0::Spec::~Spec((Spec *)local_138);
  this_00 = (MultiVertexArrayObjectTest *)operator_new(0x138);
  MultiVertexArrayObjectTest::MultiVertexArrayObjectTest
            (this_00,(this->super_TestCaseGroup).m_context,"all_attributes","all_attributes");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void VertexArrayObjectTestGroup::init (void)
{
	BufferSpec floatCoordBuffer48_1 = { 48, 384, 2, 0, 0, GL_FLOAT, 0, 0, -1.0f, 1.0f };
	BufferSpec floatCoordBuffer48_2 = { 48, 384, 2, 0, 0, GL_FLOAT, 0, 0, -1.0f, 1.0f };

	BufferSpec shortCoordBuffer48 = { 48, 192, 2, 0, 0, GL_SHORT, -32768, 32768, 0.0f, 0.0f };

	// Different buffer
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);
		spec.buffers.push_back(floatCoordBuffer48_2);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 48;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].bufferNdx	= 1;
		spec.vao.attributes[0].bufferNdx	= 2;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_buffer", "diff_buffer"));
	}
	// Different size
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].size		= 2;
		spec.vao.attributes[0].size			= 3;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_size", "diff_size"));
	}

	// Different stride
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].stride	= 2;
		spec.state.attributes[0].stride	= 4;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_stride", "diff_stride"));
	}

	// Different types
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].type		= GL_SHORT;
		spec.state.attributes[0].type	= GL_BYTE;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_type", "diff_type"));
	}
	// Different "integer"
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_BYTE;
		state.attributes[0].integer		= GL_TRUE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.instances			= 0;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].integer	= GL_FALSE;
		spec.vao.attributes[0].integer		= GL_TRUE;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_integer", "diff_integer"));
	}
	// Different divisor
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());
		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.attributes[1].enabled		= true;
		state.attributes[1].size		= 4;
		state.attributes[1].stride		= 0;
		state.attributes[1].type		= GL_FLOAT;
		state.attributes[1].integer		= GL_FALSE;
		state.attributes[1].divisor		= 0;
		state.attributes[1].offset		= 0;
		state.attributes[1].normalized	= GL_FALSE;
		state.attributes[1].bufferNdx	= 2;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);
		spec.buffers.push_back(floatCoordBuffer48_1);

		spec.useDrawElements	= false;
		spec.instances			= 10;
		spec.count				= 12;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[1].divisor		= 3;
		spec.state.attributes[1].divisor	= 2;

		addChild(new VertexArrayObjectTest(m_context, spec, "diff_divisor", "diff_divisor"));
	}
	// Different offset
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].offset	= 2;
		spec.state.attributes[0].offset	= 4;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_offset", "diff_offset"));
	}
	// Different normalize
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 48;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].normalized	= GL_TRUE;
		spec.state.attributes[0].normalized	= GL_FALSE;;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_normalize", "diff_normalize"));
	}
	// DrawElements with buffer / Pointer
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);

		BufferSpec indexBuffer = { 24, 192, 1, 0, 0, GL_UNSIGNED_SHORT, 0, 48, 0.0f, 0.0f };
		spec.buffers.push_back(indexBuffer);

		spec.useDrawElements	= true;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.instances			= 0;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 48;
		spec.indexType			= GL_UNSIGNED_SHORT;
		spec.indexCount			= 24;

		spec.state.elementArrayBuffer	= 0;
		spec.vao.elementArrayBuffer		= 2;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_indices", "diff_indices"));
	}
	// Use all attributes

	addChild(new MultiVertexArrayObjectTest(m_context, "all_attributes", "all_attributes"));
}